

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1fd0be::BuildEngineImpl::taskDiscoveredDependency
          (BuildEngineImpl *this,Task *task,KeyType *key)

{
  BuildEngineDelegate *pBVar1;
  bool bVar2;
  TaskInfo *pTVar3;
  KeyID id;
  KeyID dependencyID;
  TaskInfo *taskInfo;
  KeyType *key_local;
  Task *task_local;
  BuildEngineImpl *this_local;
  undefined4 extraout_var;
  
  pTVar3 = getTaskInfo(this,task);
  if (pTVar3 == (TaskInfo *)0x0) {
    __assert_fail("taskInfo && \"cannot request inputs for an unknown task\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                  ,0x6f9,
                  "void (anonymous namespace)::BuildEngineImpl::taskDiscoveredDependency(Task *, const KeyType &)"
                 );
  }
  bVar2 = RuleInfo::isInProgressComputing(pTVar3->forRuleInfo);
  if (bVar2) {
    id._value._0_4_ = (*(this->super_BuildDBDelegate)._vptr_BuildDBDelegate[2])(this,key);
    id._value._4_4_ = extraout_var;
    llbuild::core::DependencyKeyIDs::push_back(&pTVar3->discoveredDependencies,id,false,false);
  }
  else {
    pBVar1 = this->delegate;
    llvm::Twine::Twine((Twine *)&dependencyID,"invalid state for adding discovered dependency");
    (*pBVar1->_vptr_BuildEngineDelegate[7])(pBVar1,&dependencyID);
    std::atomic<bool>::operator=(&this->buildCancelled,true);
  }
  return;
}

Assistant:

void taskDiscoveredDependency(Task* task, const KeyType& key) {
    // Find the task info.
    auto taskInfo = getTaskInfo(task);
    assert(taskInfo && "cannot request inputs for an unknown task");

    if (!taskInfo->forRuleInfo->isInProgressComputing()) {
      delegate.error("invalid state for adding discovered dependency");
      buildCancelled = true;
      return;
    }

    auto dependencyID = getKeyID(key);
    taskInfo->discoveredDependencies.push_back(dependencyID, false, false);
  }